

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ScopedElement * __thiscall
doctest::anon_unknown_14::XmlWriter::ScopedElement::writeText
          (ScopedElement *this,string *text,bool indent)

{
  bool bVar1;
  XmlWriter *this_00;
  ostream *os;
  XmlEncode XStack_58;
  
  if (text->_M_string_length != 0) {
    this_00 = this->m_writer;
    bVar1 = this_00->m_tagIsOpen;
    ensureTagClosed(this_00);
    if ((indent & bVar1) == 1) {
      std::operator<<(this_00->m_os,(string *)&this_00->m_indent);
    }
    os = this_00->m_os;
    std::__cxx11::string::string((string *)&XStack_58,(string *)text);
    XStack_58.m_forWhat = ForTextNodes;
    anon_unknown_14::operator<<(os,&XStack_58);
    std::__cxx11::string::~string((string *)&XStack_58);
    this_00->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::writeText( std::string const& text, bool indent ) {
        m_writer->writeText( text, indent );
        return *this;
    }